

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::BeginWrite3dmChunk(ON_BinaryArchive *this,uint typecode,int value)

{
  bool bVar1;
  ulong value64;
  ON__UINT32 u32;
  
  if (value == 0) {
    value64 = 0;
  }
  else {
    value64 = (ulong)(uint)value;
    bVar1 = ON_IsUnsignedChunkTypecode(typecode);
    if (!bVar1) {
      value64 = (ulong)value;
    }
  }
  bVar1 = BeginWrite3dmBigChunk(this,typecode,value64);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmChunk( unsigned int typecode, int value )
{
  ON__INT64 value64 = 0;
  if ( 0 != value )
  {
    if ( ON_IsUnsignedChunkTypecode(typecode) )
    {
      // treat value parameter as an unsigned int
      ON__UINT32 u32 = (ON__UINT32)value;
      ON__UINT64 u64 = u32;
      value64 = (ON__INT64)u64;
    }
    else
    {
      // treat value paramter is a signed int
      value64 = value;
    }
  }
  return BeginWrite3dmBigChunk(typecode,value64);
}